

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O0

void StoreTrivialContextMap
               (EncodeContextMapArena *arena,size_t num_types,size_t context_bits,HuffmanTree *tree,
               size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  HuffmanTree *tree_00;
  uint8_t *depth;
  uint32_t *in_RCX;
  uint16_t *in_RDX;
  ulong in_RSI;
  undefined4 *in_RDI;
  size_t *in_R8;
  uint8_t *in_R9;
  size_t code;
  size_t i;
  uint16_t *bits;
  uint8_t *depths;
  uint32_t *histogram;
  size_t alphabet_size;
  size_t repeat_bits;
  size_t repeat_code;
  uint64_t v_5;
  uint8_t *p_5;
  uint64_t v_4;
  uint8_t *p_4;
  uint64_t v_3;
  uint8_t *p_3;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  long local_1f8;
  uint16_t *local_1e8;
  uint16_t *bits_00;
  size_t *in_stack_fffffffffffffef0;
  uint8_t *in_stack_fffffffffffffef8;
  
  StoreVarLenUint8(in_RSI - 1,in_R8,in_R9);
  if (1 < in_RSI) {
    tree_00 = (HuffmanTree *)((long)in_RDX - 1);
    depth = (uint8_t *)(ulong)((1 << ((byte)tree_00 & 0x1f)) - 1);
    bits_00 = (uint16_t *)((long)&tree_00->total_count_ + in_RSI);
    memset(in_RDI,0,(long)bits_00 * 4);
    *(ulong *)(in_R9 + (*in_R8 >> 3)) =
         1L << ((byte)*in_R8 & 7) | (ulong)(byte)*(ulong *)(in_R9 + (*in_R8 >> 3));
    *in_R8 = *in_R8 + 1;
    *(ulong *)(in_R9 + (*in_R8 >> 3)) =
         (long)((long)&tree_00[-1].index_right_or_value_ + 1) << ((byte)*in_R8 & 7) |
         (ulong)(byte)*(ulong *)(in_R9 + (*in_R8 >> 3));
    *in_R8 = *in_R8 + 4;
    in_RDI[(long)tree_00] = (int)in_RSI;
    *in_RDI = 1;
    for (local_1e8 = in_RDX; local_1e8 < bits_00; local_1e8 = (uint16_t *)((long)local_1e8 + 1)) {
      in_RDI[(long)local_1e8] = 1;
    }
    BuildAndStoreHuffmanTree
              (in_RCX,(size_t)in_R8,(size_t)in_R9,tree_00,depth,bits_00,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffef8);
    for (local_1e8 = (uint16_t *)0x0; local_1e8 < in_RSI;
        local_1e8 = (uint16_t *)((long)local_1e8 + 1)) {
      if (local_1e8 == (uint16_t *)0x0) {
        local_1f8 = 0;
      }
      else {
        local_1f8 = (long)in_RDX + ((long)local_1e8 - 1U);
      }
      bVar1 = *(byte *)((long)(in_RDI + 0x110) + local_1f8);
      *(ulong *)(in_R9 + (*in_R8 >> 3)) =
           (ulong)*(ushort *)((long)in_RDI + local_1f8 * 2 + 0x550) << ((byte)*in_R8 & 7) |
           (ulong)(byte)*(ulong *)(in_R9 + (*in_R8 >> 3));
      *in_R8 = (ulong)bVar1 + *in_R8;
      bVar1 = *(byte *)((long)(in_RDI + 0x110) + (long)tree_00);
      *(ulong *)(in_R9 + (*in_R8 >> 3)) =
           (ulong)*(ushort *)((long)in_RDI + (long)tree_00 * 2 + 0x550) << ((byte)*in_R8 & 7) |
           (ulong)(byte)*(ulong *)(in_R9 + (*in_R8 >> 3));
      *in_R8 = (ulong)bVar1 + *in_R8;
      *(ulong *)(in_R9 + (*in_R8 >> 3)) =
           (long)depth << ((byte)*in_R8 & 7) | (ulong)(byte)*(ulong *)(in_R9 + (*in_R8 >> 3));
      *in_R8 = (long)&tree_00->total_count_ + *in_R8;
    }
    *(ulong *)(in_R9 + (*in_R8 >> 3)) =
         1L << ((byte)*in_R8 & 7) | (ulong)(byte)*(ulong *)(in_R9 + (*in_R8 >> 3));
    *in_R8 = *in_R8 + 1;
  }
  return;
}

Assistant:

static void StoreTrivialContextMap(EncodeContextMapArena* arena,
                                   size_t num_types,
                                   size_t context_bits,
                                   HuffmanTree* tree,
                                   size_t* storage_ix,
                                   uint8_t* storage) {
  StoreVarLenUint8(num_types - 1, storage_ix, storage);
  if (num_types > 1) {
    size_t repeat_code = context_bits - 1u;
    size_t repeat_bits = (1u << repeat_code) - 1u;
    size_t alphabet_size = num_types + repeat_code;
    uint32_t* BROTLI_RESTRICT const histogram = arena->histogram;
    uint8_t* BROTLI_RESTRICT const depths = arena->depths;
    uint16_t* BROTLI_RESTRICT const bits = arena->bits;
    size_t i;
    memset(histogram, 0, alphabet_size * sizeof(histogram[0]));
    /* Write RLEMAX. */
    BrotliWriteBits(1, 1, storage_ix, storage);
    BrotliWriteBits(4, repeat_code - 1, storage_ix, storage);
    histogram[repeat_code] = (uint32_t)num_types;
    histogram[0] = 1;
    for (i = context_bits; i < alphabet_size; ++i) {
      histogram[i] = 1;
    }
    BuildAndStoreHuffmanTree(histogram, alphabet_size, alphabet_size,
                             tree, depths, bits, storage_ix, storage);
    for (i = 0; i < num_types; ++i) {
      size_t code = (i == 0 ? 0 : i + context_bits - 1);
      BrotliWriteBits(depths[code], bits[code], storage_ix, storage);
      BrotliWriteBits(
          depths[repeat_code], bits[repeat_code], storage_ix, storage);
      BrotliWriteBits(repeat_code, repeat_bits, storage_ix, storage);
    }
    /* Write IMTF (inverse-move-to-front) bit. */
    BrotliWriteBits(1, 1, storage_ix, storage);
  }
}